

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QTuioCursor * __thiscall
QMap<int,_QTuioCursor>::value
          (QTuioCursor *__return_storage_ptr__,QMap<int,_QTuioCursor> *this,int *key,
          QTuioCursor *defaultValue)

{
  QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
  *pQVar1;
  float fVar2;
  float fVar3;
  State SVar4;
  undefined3 uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  _Rb_tree_header *p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                 *)0x0) {
    p_Var12 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    p_Var10 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = &p_Var10->_M_header;
    if (p_Var12 != (_Base_ptr)0x0) {
      do {
        if (*key <= (int)p_Var12[1]._M_color) {
          p_Var11 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < *key];
      } while (p_Var12 != (_Base_ptr)0x0);
    }
    p_Var12 = &p_Var10->_M_header;
    if (((_Rb_tree_header *)p_Var11 != p_Var10) &&
       (p_Var12 = p_Var11, *key < (int)p_Var11[1]._M_color)) {
      p_Var12 = &p_Var10->_M_header;
    }
    if ((_Rb_tree_header *)p_Var12 != p_Var10) {
      defaultValue = (QTuioCursor *)&p_Var12[1].field_0x4;
    }
  }
  iVar6 = defaultValue->m_id;
  fVar7 = defaultValue->m_x;
  fVar8 = defaultValue->m_y;
  fVar9 = defaultValue->m_vx;
  fVar2 = defaultValue->m_vy;
  fVar3 = defaultValue->m_acceleration;
  SVar4 = defaultValue->m_state;
  uVar5 = *(undefined3 *)&defaultValue->field_0x19;
  __return_storage_ptr__->m_vx = defaultValue->m_vx;
  __return_storage_ptr__->m_vy = fVar2;
  __return_storage_ptr__->m_acceleration = fVar3;
  __return_storage_ptr__->m_state = SVar4;
  *(undefined3 *)&__return_storage_ptr__->field_0x19 = uVar5;
  __return_storage_ptr__->m_id = iVar6;
  __return_storage_ptr__->m_x = fVar7;
  __return_storage_ptr__->m_y = fVar8;
  __return_storage_ptr__->m_vx = fVar9;
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }